

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::computeHidden(Model *this,vector<int,_std::allocator<int>_> *input,State *state)

{
  int *piVar1;
  Vector *this_00;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  
  this_00 = &state->hidden;
  Vector::zero(this_00);
  auVar3 = in_ZMM0._0_16_;
  piVar1 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = piVar1;
  if (piVar1 != (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      Vector::addRow(this_00,(this->wi_).
                             super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,(long)*piVar2);
      auVar3 = in_ZMM0._0_16_;
      piVar2 = piVar2 + 1;
    } while (piVar2 != (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
    piVar1 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  }
  auVar3 = vcvtusi2sd_avx512f(auVar3,(long)piVar2 - (long)piVar1 >> 2);
  Vector::mul(this_00,(float)(1.0 / auVar3._0_8_));
  return;
}

Assistant:

void Model::computeHidden(const std::vector<int32_t>& input, State& state)
    const {
  Vector& hidden = state.hidden;
  hidden.zero();
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    hidden.addRow(*wi_, *it);
  }
  hidden.mul(1.0 / input.size());
}